

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O2

void __thiscall chrono::ChContactContainerNSC::EndAddContact(ChContactContainerNSC *this)

{
  const_iterator __position;
  const_iterator __position_00;
  const_iterator __position_01;
  const_iterator __position_02;
  const_iterator __position_03;
  const_iterator __position_04;
  const_iterator __position_05;
  const_iterator __position_06;
  const_iterator __position_07;
  const_iterator __position_08;
  const_iterator __position_09;
  
  __position._M_node = (this->lastcontact_6_6)._M_node;
  while (__position._M_node != (_List_node_base *)&this->contactlist_6_6) {
    if (__position._M_node[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(__position._M_node[1]._M_next)->_M_next->_M_prev)();
      __position._M_node = (this->lastcontact_6_6)._M_node;
    }
    __position._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
         ::erase(&this->contactlist_6_6,__position);
    (this->lastcontact_6_6)._M_node = __position._M_node;
  }
  __position_00._M_node = (this->lastcontact_6_3)._M_node;
  while (__position_00._M_node != (_List_node_base *)&this->contactlist_6_3) {
    if (__position_00._M_node[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(__position_00._M_node[1]._M_next)->_M_next->_M_prev)();
      __position_00._M_node = (this->lastcontact_6_3)._M_node;
    }
    __position_00._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
         ::erase(&this->contactlist_6_3,__position_00);
    (this->lastcontact_6_3)._M_node = __position_00._M_node;
  }
  __position_01._M_node = (this->lastcontact_3_3)._M_node;
  while (__position_01._M_node != (_List_node_base *)&this->contactlist_3_3) {
    if (__position_01._M_node[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(__position_01._M_node[1]._M_next)->_M_next->_M_prev)();
      __position_01._M_node = (this->lastcontact_3_3)._M_node;
    }
    __position_01._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*>_>
         ::erase(&this->contactlist_3_3,__position_01);
    (this->lastcontact_3_3)._M_node = __position_01._M_node;
  }
  __position_02._M_node = (this->lastcontact_333_3)._M_node;
  while (__position_02._M_node != (_List_node_base *)&this->contactlist_333_3) {
    if (__position_02._M_node[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(__position_02._M_node[1]._M_next)->_M_next->_M_prev)();
      __position_02._M_node = (this->lastcontact_333_3)._M_node;
    }
    __position_02._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
         ::erase(&this->contactlist_333_3,__position_02);
    (this->lastcontact_333_3)._M_node = __position_02._M_node;
  }
  __position_03._M_node = (this->lastcontact_333_6)._M_node;
  while (__position_03._M_node != (_List_node_base *)&this->contactlist_333_6) {
    if (__position_03._M_node[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(__position_03._M_node[1]._M_next)->_M_next->_M_prev)();
      __position_03._M_node = (this->lastcontact_333_6)._M_node;
    }
    __position_03._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*>_>
         ::erase(&this->contactlist_333_6,__position_03);
    (this->lastcontact_333_6)._M_node = __position_03._M_node;
  }
  __position_04._M_node = (this->lastcontact_333_333)._M_node;
  while (__position_04._M_node != (_List_node_base *)&this->contactlist_333_333) {
    if (__position_04._M_node[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(__position_04._M_node[1]._M_next)->_M_next->_M_prev)();
      __position_04._M_node = (this->lastcontact_333_333)._M_node;
    }
    __position_04._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
         ::erase(&this->contactlist_333_333,__position_04);
    (this->lastcontact_333_333)._M_node = __position_04._M_node;
  }
  __position_05._M_node = (this->lastcontact_666_3)._M_node;
  while (__position_05._M_node != (_List_node_base *)&this->contactlist_666_3) {
    if (__position_05._M_node[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(__position_05._M_node[1]._M_next)->_M_next->_M_prev)();
      __position_05._M_node = (this->lastcontact_666_3)._M_node;
    }
    __position_05._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*>_>
         ::erase(&this->contactlist_666_3,__position_05);
    (this->lastcontact_666_3)._M_node = __position_05._M_node;
  }
  __position_06._M_node = (this->lastcontact_666_6)._M_node;
  while (__position_06._M_node != (_List_node_base *)&this->contactlist_666_6) {
    if (__position_06._M_node[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(__position_06._M_node[1]._M_next)->_M_next->_M_prev)();
      __position_06._M_node = (this->lastcontact_666_6)._M_node;
    }
    __position_06._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*>_>
         ::erase(&this->contactlist_666_6,__position_06);
    (this->lastcontact_666_6)._M_node = __position_06._M_node;
  }
  __position_07._M_node = (this->lastcontact_666_333)._M_node;
  while (__position_07._M_node != (_List_node_base *)&this->contactlist_666_333) {
    if (__position_07._M_node[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(__position_07._M_node[1]._M_next)->_M_next->_M_prev)();
      __position_07._M_node = (this->lastcontact_666_333)._M_node;
    }
    __position_07._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
         ::erase(&this->contactlist_666_333,__position_07);
    (this->lastcontact_666_333)._M_node = __position_07._M_node;
  }
  __position_08._M_node = (this->lastcontact_666_666)._M_node;
  while (__position_08._M_node != (_List_node_base *)&this->contactlist_666_666) {
    if (__position_08._M_node[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(__position_08._M_node[1]._M_next)->_M_next->_M_prev)();
      __position_08._M_node = (this->lastcontact_666_666)._M_node;
    }
    __position_08._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
         ::erase(&this->contactlist_666_666,__position_08);
    (this->lastcontact_666_666)._M_node = __position_08._M_node;
  }
  __position_09._M_node = (this->lastcontact_6_6_rolling)._M_node;
  while (__position_09._M_node != (_List_node_base *)&this->contactlist_6_6_rolling) {
    if (__position_09._M_node[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(__position_09._M_node[1]._M_next)->_M_next->_M_prev)();
      __position_09._M_node = (this->lastcontact_6_6_rolling)._M_node;
    }
    __position_09._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
         ::erase(&this->contactlist_6_6_rolling,__position_09);
    (this->lastcontact_6_6_rolling)._M_node = __position_09._M_node;
  }
  return;
}

Assistant:

void ChContactContainerNSC::EndAddContact() {
    // remove contacts that are beyond last contact
    while (lastcontact_6_6 != contactlist_6_6.end()) {
        delete (*lastcontact_6_6);
        lastcontact_6_6 = contactlist_6_6.erase(lastcontact_6_6);
    }
    while (lastcontact_6_3 != contactlist_6_3.end()) {
        delete (*lastcontact_6_3);
        lastcontact_6_3 = contactlist_6_3.erase(lastcontact_6_3);
    }
    while (lastcontact_3_3 != contactlist_3_3.end()) {
        delete (*lastcontact_3_3);
        lastcontact_3_3 = contactlist_3_3.erase(lastcontact_3_3);
    }
    while (lastcontact_333_3 != contactlist_333_3.end()) {
        delete (*lastcontact_333_3);
        lastcontact_333_3 = contactlist_333_3.erase(lastcontact_333_3);
    }
    while (lastcontact_333_6 != contactlist_333_6.end()) {
        delete (*lastcontact_333_6);
        lastcontact_333_6 = contactlist_333_6.erase(lastcontact_333_6);
    }
    while (lastcontact_333_333 != contactlist_333_333.end()) {
        delete (*lastcontact_333_333);
        lastcontact_333_333 = contactlist_333_333.erase(lastcontact_333_333);
    }
    while (lastcontact_666_3 != contactlist_666_3.end()) {
        delete (*lastcontact_666_3);
        lastcontact_666_3 = contactlist_666_3.erase(lastcontact_666_3);
    }
    while (lastcontact_666_6 != contactlist_666_6.end()) {
        delete (*lastcontact_666_6);
        lastcontact_666_6 = contactlist_666_6.erase(lastcontact_666_6);
    }
    while (lastcontact_666_333 != contactlist_666_333.end()) {
        delete (*lastcontact_666_333);
        lastcontact_666_333 = contactlist_666_333.erase(lastcontact_666_333);
    }
    while (lastcontact_666_666 != contactlist_666_666.end()) {
        delete (*lastcontact_666_666);
        lastcontact_666_666 = contactlist_666_666.erase(lastcontact_666_666);
    }

    while (lastcontact_6_6_rolling != contactlist_6_6_rolling.end()) {
        delete (*lastcontact_6_6_rolling);
        lastcontact_6_6_rolling = contactlist_6_6_rolling.erase(lastcontact_6_6_rolling);
    }
}